

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rasterizer.hpp
# Opt level: O1

void __thiscall
eos::render::Rasterizer<eos::render::TexturingFragmentShader>::raster_triangle<float>
          (Rasterizer<eos::render::TexturingFragmentShader> *this,Vertex<float> *point_a,
          Vertex<float> *point_b,Vertex<float> *point_c,optional<eos::render::Texture> *texture)

{
  Image1d *this_00;
  Image4u *this_01;
  char cVar1;
  int *piVar2;
  double dVar3;
  float fVar4;
  double *pdVar5;
  Pixel<unsigned_char,_4> *pPVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  Rasterizer<eos::render::TexturingFragmentShader> *pRVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  double dVar19;
  float fVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  float fVar24;
  double dVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  double dVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  double dVar37;
  float fVar38;
  double dVar39;
  double dVar40;
  Rect<int> RVar41;
  ulong local_190;
  Vector3<float> local_188;
  float local_17c;
  uint local_178;
  uint local_174;
  Rasterizer<eos::render::TexturingFragmentShader> *local_170;
  plane gamma_plane;
  Vector3<float> lambda;
  plane beta_plane;
  plane alpha_plane;
  Vector3<float> local_3c;
  
  alpha_plane.a =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  alpha_plane.b =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  beta_plane.a = (point_b->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                 m_storage.m_data.array[0];
  beta_plane.b = (point_b->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                 m_storage.m_data.array[1];
  gamma_plane.a =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  gamma_plane.b =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  local_170 = this;
  RVar41 = detail::calculate_clipped_bounding_box<float>
                     ((Vector2<float> *)&alpha_plane,(Vector2<float> *)&beta_plane,
                      (Vector2<float> *)&gamma_plane,this->viewport_width,this->viewport_height);
  beta_plane.a = (point_a->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                 m_storage.m_data.array[0];
  beta_plane.c = (point_a->texcoords).super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                 m_storage.m_data.array[0] *
                 (point_a->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                 m_storage.m_data.array[3];
  beta_plane.b = (point_a->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                 m_storage.m_data.array[1];
  gamma_plane.a =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  gamma_plane.c =
       (point_b->texcoords).super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[0] *
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  gamma_plane.b =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  local_188.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_188.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_c->texcoords).super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[0] *
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_188.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  detail::plane::plane<float>
            (&alpha_plane,(Vector3<float> *)&beta_plane,(Vector3<float> *)&gamma_plane,&local_188);
  gamma_plane.a =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  gamma_plane.c =
       (point_a->texcoords).super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[1] *
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  gamma_plane.b =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  local_188.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_188.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_b->texcoords).super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[1] *
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_188.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  lambda.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  lambda.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_c->texcoords).super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[1] *
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  lambda.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  detail::plane::plane<float>(&beta_plane,(Vector3<float> *)&gamma_plane,&local_188,&lambda);
  local_188.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_188.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  local_188.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  lambda.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  lambda.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  lambda.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_3c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_3c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  local_3c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  detail::plane::plane<float>(&gamma_plane,&local_188,&lambda,&local_3c);
  if (-1 < RVar41._8_8_) {
    fVar20 = 1.0 / alpha_plane.c;
    fVar24 = 1.0 / beta_plane.c;
    fVar15 = 1.0 / gamma_plane.c;
    fVar26 = -alpha_plane.a;
    fVar27 = -beta_plane.a;
    fVar28 = -gamma_plane.a;
    fVar29 = -alpha_plane.b;
    fVar34 = -beta_plane.b;
    fVar36 = -gamma_plane.b;
    iVar7 = RVar41.y;
    iVar10 = RVar41.height + iVar7;
    iVar8 = RVar41.x;
    iVar11 = iVar8 + RVar41.width;
    if (iVar11 <= iVar8) {
      iVar11 = iVar8;
    }
    this_00 = &local_170->depthbuffer;
    if (iVar10 <= iVar7) {
      iVar10 = iVar7;
    }
    this_01 = &local_170->colorbuffer;
    uVar12 = iVar11 + 1;
    pRVar13 = local_170;
    local_190 = RVar41._0_8_ >> 0x20;
    local_174 = uVar12;
    do {
      if (-1 < RVar41.width) {
        fVar16 = (float)(int)local_190 + 0.5;
        dVar21 = (double)fVar16;
        local_178 = (uint)fVar16;
        uVar9 = RVar41._0_8_ & 0xffffffff;
        do {
          iVar8 = (int)uVar9;
          dVar37 = (double)(point_b->position).
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[1];
          dVar23 = (double)(point_c->position).
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[1];
          dVar25 = (double)(point_a->position).
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[0];
          dVar19 = (double)(point_c->position).
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[0];
          dVar22 = (double)(point_b->position).
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[0];
          dVar40 = (double)(point_a->position).
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[1];
          fVar38 = (float)iVar8 + 0.5;
          dVar3 = (double)fVar38;
          dVar33 = ((dVar40 - dVar37) * dVar3 + (dVar22 - dVar25) * dVar21 + dVar25 * dVar37 +
                   -dVar22 * dVar40) *
                   (1.0 / ((dVar40 - dVar37) * dVar19 + (dVar22 - dVar25) * dVar23 + dVar25 * dVar37
                          + -dVar22 * dVar40));
          if (((0.0 <= dVar33) &&
              (dVar39 = ((dVar23 - dVar40) * dVar3 + (dVar25 - dVar19) * dVar21 + dVar19 * dVar40 +
                        -dVar25 * dVar23) *
                        (1.0 / ((dVar23 - dVar40) * dVar22 + (dVar25 - dVar19) * dVar37 +
                                dVar19 * dVar40 + -dVar25 * dVar23)), 0.0 <= dVar39)) &&
             (dVar37 = ((dVar37 - dVar23) * dVar3 + (dVar19 - dVar22) * dVar21 + dVar22 * dVar23 +
                       -dVar19 * dVar37) *
                       (1.0 / (dVar25 * (dVar37 - dVar23) + dVar40 * (dVar19 - dVar22) +
                               dVar22 * dVar23 + -dVar19 * dVar37)), 0.0 <= dVar37)) {
            dVar23 = (double)(point_c->position).
                             super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                             m_data.array[2] * dVar33 +
                     (double)(point_a->position).
                             super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                             m_data.array[2] * dVar37 +
                     (double)(point_b->position).
                             super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                             m_data.array[2] * dVar39;
            cVar1 = pRVar13->enable_depth_test;
            if ((bool)cVar1 == true) {
              bVar14 = pRVar13->enable_far_clipping;
              pdVar5 = core::Image<double>::operator()(this_00,(int)local_190,iVar8);
              pRVar13 = local_170;
              if ((byte)(*pdVar5 <= dVar23 | 1.0 < dVar23 & bVar14) == 1) {
                cVar1 = local_170->enable_depth_test;
                uVar12 = local_174;
                goto joined_r0x00112f3e;
              }
            }
            else {
joined_r0x00112f3e:
              if (cVar1 != '\0') goto LAB_0011328f;
            }
            if (pRVar13->perspective_correct_barycentric_weights == true) {
              dVar22 = (double)(point_a->position).
                               super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage
                               .m_data.array[3];
              dVar25 = (double)(point_b->position).
                               super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage
                               .m_data.array[3];
              dVar19 = (double)(point_c->position).
                               super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage
                               .m_data.array[3];
              dVar3 = 1.0 / (dVar33 * dVar19 + dVar37 * dVar22 + dVar39 * dVar25);
              dVar37 = dVar37 * dVar22 * dVar3;
              dVar39 = dVar39 * dVar25 * dVar3;
              dVar33 = dVar33 * dVar3 * dVar19;
            }
            lambda.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0] = (float)dVar37;
            lambda.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1] = (float)dVar39;
            lambda.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2] = (float)dVar33;
            if ((texture->super__Optional_base<eos::render::Texture,_false,_false>)._M_payload.
                super__Optional_payload<eos::render::Texture,_true,_false,_false>.
                super__Optional_payload_base<eos::render::Texture>._M_engaged == true) {
              if ((texture->super__Optional_base<eos::render::Texture,_false,_false>)._M_payload.
                  super__Optional_payload<eos::render::Texture,_true,_false,_false>.
                  super__Optional_payload_base<eos::render::Texture>._M_engaged == false) {
                std::__throw_bad_optional_access();
              }
              fVar17 = -(gamma_plane.a * fVar38 + gamma_plane.b * fVar16 + gamma_plane.d) * fVar15;
              fVar30 = (beta_plane.a * fVar38 + beta_plane.b * fVar16 + beta_plane.d) * fVar24;
              fVar4 = 1.0 / (fVar17 * fVar17);
              fVar35 = (alpha_plane.a * fVar38 + alpha_plane.b * fVar16 + alpha_plane.d) * fVar20;
              piVar2 = *(int **)&(texture->super__Optional_base<eos::render::Texture,_false,_false>)
                                 ._M_payload.
                                 super__Optional_payload<eos::render::Texture,_true,_false,_false>.
                                 super__Optional_payload_base<eos::render::Texture>._M_payload.
                                 _M_value.mipmaps.
                                 super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
              ;
              fVar31 = (float)piVar2[1];
              fVar18 = (fVar17 * fVar26 * fVar20 + fVar35 * fVar28 * fVar15) * fVar4 * fVar31;
              fVar31 = (fVar27 * fVar24 * fVar17 + fVar30 * fVar28 * fVar15) * fVar4 * fVar31;
              fVar32 = (float)*piVar2;
              fVar35 = (fVar29 * fVar20 * fVar17 + fVar36 * fVar15 * fVar35) * fVar4 * fVar32;
              fVar32 = (fVar34 * fVar24 * fVar17 + fVar36 * fVar15 * fVar30) * fVar4 * fVar32;
            }
            else {
              fVar18 = 0.0;
              fVar31 = 0.0;
              fVar35 = 0.0;
              fVar32 = 0.0;
            }
            TexturingFragmentShader::shade_triangle_pixel<float>
                      ((TexturingFragmentShader *)&local_188,(int)pRVar13,(int)fVar38,
                       (Vertex<float> *)(ulong)local_178,point_a,point_b,(Vector3<float> *)point_c,
                       (optional<eos::render::Texture> *)&lambda,fVar18,fVar31,fVar35,fVar32);
            fVar38 = 1.0;
            if (local_188.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0] <= 1.0) {
              fVar38 = local_188.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[0];
            }
            fVar18 = 1.0;
            if (local_188.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[1] <= 1.0) {
              fVar18 = local_188.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[1];
            }
            fVar31 = 1.0;
            if (local_188.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[2] <= 1.0) {
              fVar31 = local_188.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[2];
            }
            fVar35 = 1.0;
            if (local_17c <= 1.0) {
              fVar35 = local_17c;
            }
            pPVar6 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                               (this_01,(int)local_190,iVar8);
            (pPVar6->data_)._M_elems[0] = (uchar)(int)(fVar31 * 255.0);
            pPVar6 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                               (this_01,(int)local_190,iVar8);
            (pPVar6->data_)._M_elems[1] = (uchar)(int)(fVar18 * 255.0);
            pPVar6 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                               (this_01,(int)local_190,iVar8);
            (pPVar6->data_)._M_elems[2] = (uchar)(int)(fVar38 * 255.0);
            pPVar6 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                               (this_01,(int)local_190,iVar8);
            (pPVar6->data_)._M_elems[3] = (uchar)(int)(fVar35 * 255.0);
            pRVar13 = local_170;
            uVar12 = local_174;
            if (local_170->enable_depth_test == true) {
              pdVar5 = core::Image<double>::operator()(this_00,(int)local_190,iVar8);
              *pdVar5 = dVar23;
              pRVar13 = local_170;
              uVar12 = local_174;
            }
          }
LAB_0011328f:
          uVar9 = (ulong)(iVar8 + 1U);
        } while (uVar12 != iVar8 + 1U);
      }
      bVar14 = (int)local_190 != iVar10;
      local_190 = (ulong)((int)local_190 + 1);
    } while (bVar14);
  }
  return;
}

Assistant:

void raster_triangle(const detail::Vertex<T>& point_a, const detail::Vertex<T>& point_b,
                         const detail::Vertex<T>& point_c, const cpp17::optional<Texture>& texture)
    {
        // We already calculated this in the culling/clipping stage. Maybe we should save/cache it after all.
        const auto boundingBox = detail::calculate_clipped_bounding_box(
            Eigen::Vector2<T>(point_a.position.x(), point_a.position.y()),
            Eigen::Vector2<T>(point_b.position.x(), point_b.position.y()),
            Eigen::Vector2<T>(point_c.position.x(), point_c.position.y()), viewport_width, viewport_height);
        const auto min_x = boundingBox.x;
        const auto max_x = boundingBox.x + boundingBox.width;
        const auto min_y = boundingBox.y;
        const auto max_y = boundingBox.y + boundingBox.height;

        // These are triangle-specific, i.e. calculate once per triangle.
        // These ones are needed for perspective correct lambdas! (as well as mipmapping)
        const auto& one_over_w0 = point_a.position[3];
        const auto& one_over_w1 = point_b.position[3];
        const auto& one_over_w2 = point_c.position[3];

        // These are triangle-specific, i.e. calculate once per triangle.
        // For partial derivatives computation (for mipmapping, texturing) (they work on screen-space coords):
        using eos::render::detail::plane;
        const auto alpha_plane = plane(
            Eigen::Vector3<T>(point_a.position[0], point_a.position[1], point_a.texcoords[0] * one_over_w0),
            Eigen::Vector3<T>(point_b.position[0], point_b.position[1], point_b.texcoords[0] * one_over_w1),
            Eigen::Vector3<T>(point_c.position[0], point_c.position[1], point_c.texcoords[0] * one_over_w2));
        const auto beta_plane = plane(
            Eigen::Vector3<T>(point_a.position[0], point_a.position[1], point_a.texcoords[1] * one_over_w0),
            Eigen::Vector3<T>(point_b.position[0], point_b.position[1], point_b.texcoords[1] * one_over_w1),
            Eigen::Vector3<T>(point_c.position[0], point_c.position[1], point_c.texcoords[1] * one_over_w2));
        const auto gamma_plane =
            plane(Eigen::Vector3<T>(point_a.position[0], point_a.position[1], one_over_w0),
                  Eigen::Vector3<T>(point_b.position[0], point_b.position[1], one_over_w1),
                  Eigen::Vector3<T>(point_c.position[0], point_c.position[1], one_over_w2));
        const auto one_over_alpha_c = 1.0f / alpha_plane.c;
        const auto one_over_beta_c = 1.0f / beta_plane.c;
        const auto one_over_gamma_c = 1.0f / gamma_plane.c;
        const auto alpha_ffx = -alpha_plane.a * one_over_alpha_c;
        const auto beta_ffx = -beta_plane.a * one_over_beta_c;
        const auto gamma_ffx = -gamma_plane.a * one_over_gamma_c;
        const auto alpha_ffy = -alpha_plane.b * one_over_alpha_c;
        const auto beta_ffy = -beta_plane.b * one_over_beta_c;
        const auto gamma_ffy = -gamma_plane.b * one_over_gamma_c;

        for (int yi = min_y; yi <= max_y; ++yi)
        {
            for (int xi = min_x; xi <= max_x; ++xi)
            {
                // we want centers of pixels to be used in computations. Todo: Do we? Do we pass it with or
                // without +0.5 to the FragShader?
                const float x = static_cast<float>(xi) + 0.5f; // double? T?
                const float y = static_cast<float>(yi) + 0.5f;

                // These will be used for barycentric weights computation
                using detail::implicit_line;
                const double one_over_v0ToLine12 =
                    1.0 / implicit_line(point_a.position[0], point_a.position[1], point_b.position,
                                        point_c.position);
                const double one_over_v1ToLine20 =
                    1.0 / implicit_line(point_b.position[0], point_b.position[1], point_c.position,
                                        point_a.position);
                const double one_over_v2ToLine01 =
                    1.0 / implicit_line(point_c.position[0], point_c.position[1], point_a.position,
                                        point_b.position);
                // Affine barycentric weights:
                double alpha = implicit_line(x, y, point_b.position, point_c.position) * one_over_v0ToLine12;
                double beta = implicit_line(x, y, point_c.position, point_a.position) * one_over_v1ToLine20;
                double gamma = implicit_line(x, y, point_a.position, point_b.position) * one_over_v2ToLine01;

                // if pixel (x, y) is inside the triangle or on one of its edges
                if (alpha >= 0 && beta >= 0 && gamma >= 0)
                {
                    const int pixel_index_row = yi;
                    const int pixel_index_col = xi;

                    // TODO: Check this one. What about perspective?
                    const double z_affine = alpha * static_cast<double>(point_a.position[2]) +
                                            beta * static_cast<double>(point_b.position[2]) +
                                            gamma * static_cast<double>(point_c.position[2]);

                    bool draw = true;
                    if (enable_far_clipping)
                    {
                        if (z_affine > 1.0)
                        {
                            draw = false;
                        }
                    }

                    bool passes_depth_test = false;
                    if (enable_depth_test)
                    {
                        // If enable_depth_test=false, avoid accessing the depthbuffer at all - it might be
                        // empty or have other dimensions.
                        passes_depth_test =
                            (z_affine < depthbuffer(pixel_index_row, pixel_index_col));
                    }
                    // The '<= 1.0' clips against the far-plane in NDC. We clip against the near-plane
                    // earlier.
                    // if (z_affine < depthbuffer.at<double>(pixelIndexRow, pixelIndexCol)/* && z_affine <=
                    // 1.0*/) // what to do in ortho case without n/f "squashing"? should we always squash? or
                    // a flag?
                    if ((passes_depth_test && draw) || enable_depth_test == false)
                    {
                        // perspective-correct barycentric weights
                        // Todo: Check this in the original/older implementation, i.e. if all is still
                        //   perspective-correct. I think so. Also compare 1:1 with OpenGL.
                        // This is the default case when rendering - we perspectively correct the barycentric
                        //   weights. However when extracting texture, it seems we don't want to do that, and
                        //   pass the uncorrected lambda in that case. This switch allows us to do that.
                        if (perspective_correct_barycentric_weights)
                        {
                            double d = alpha * one_over_w0 + beta * one_over_w1 + gamma * one_over_w2;
                            d = 1.0 / d;
                            alpha *= d * one_over_w0; // In case of affine cam matrix, everything is 1 and
                                                      // a/b/g don't get changed.
                            beta *= d * one_over_w1;
                            gamma *= d * one_over_w2;
                        }
                        Eigen::Vector3<T> lambda(alpha, beta, gamma);

                        Eigen::Vector4<T> pixel_color;
                        if (texture)
                        {
                            // check if texture != NULL?
                            // partial derivatives (for mip-mapping, not needed for texturing otherwise!)
                            const float u_over_z =
                                -(alpha_plane.a * x + alpha_plane.b * y + alpha_plane.d) * one_over_alpha_c;
                            const float v_over_z =
                                -(beta_plane.a * x + beta_plane.b * y + beta_plane.d) * one_over_beta_c;
                            const float one_over_z =
                                -(gamma_plane.a * x + gamma_plane.b * y + gamma_plane.d) * one_over_gamma_c;
                            const float one_over_squared_one_over_z = 1.0f / std::pow(one_over_z, 2);

                            // partial derivatives of U/V coordinates with respect to X/Y pixel's screen
                            // coordinates
                            // These are exclusively used for the mipmap level computation (i.e. which mipmap
                            // levels to use).
                            // They're not needed for texturing otherwise at all!
                            float dudx =
                                one_over_squared_one_over_z * (alpha_ffx * one_over_z - u_over_z * gamma_ffx);
                            float dudy =
                                one_over_squared_one_over_z * (beta_ffx * one_over_z - v_over_z * gamma_ffx);
                            float dvdx =
                                one_over_squared_one_over_z * (alpha_ffy * one_over_z - u_over_z * gamma_ffy);
                            float dvdy =
                                one_over_squared_one_over_z * (beta_ffy * one_over_z - v_over_z * gamma_ffy);
                            dudx *= texture.value().mipmaps[0].width();
                            dudy *= texture.value().mipmaps[0].width();
                            dvdx *= texture.value().mipmaps[0].height();
                            dvdy *= texture.value().mipmaps[0].height();

                            // Why does it need x and y? Maybe some shaders (eg TexExtr?) need it?
                            pixel_color = fragment_shader.shade_triangle_pixel(
                                x, y, point_a, point_b, point_c, lambda, texture, dudx, dudy, dvdx, dvdy);

                        } else
                        { // We use vertex-coloring
                            // Why does it need x and y?
                            pixel_color = fragment_shader.shade_triangle_pixel(
                                x, y, point_a, point_b, point_c, lambda, texture, 0, 0, 0, 0);
                        }

                        // clamp bytes to 255
                        // Todo: Proper casting (rounding?)? And we don't clamp/max against 255? Use
                        // glm::clamp?
                        const unsigned char red =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[0], T(1)));
                        const unsigned char green =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[1], T(1)));
                        const unsigned char blue =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[2], T(1)));
                        const unsigned char alpha =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[3], T(1)));

                        // update buffers
                        colorbuffer(pixel_index_row, pixel_index_col)[0] = blue;
                        colorbuffer(pixel_index_row, pixel_index_col)[1] = green;
                        colorbuffer(pixel_index_row, pixel_index_col)[2] = red;
                        colorbuffer(pixel_index_row, pixel_index_col)[3] = alpha;
                        if (enable_depth_test) // TODO: A better name for this might be enable_zbuffer? or
                                               // enable_zbuffer_test?
                        {
                            depthbuffer(pixel_index_row, pixel_index_col) = z_affine;
                        }
                    }
                }
            }
        }
    }